

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_for_of_start(JSContext *ctx,JSValue *sp,BOOL is_async)

{
  JSValue *pJVar1;
  int *piVar2;
  int64_t iVar3;
  int iVar4;
  JSValue obj;
  JSValue JVar5;
  
  pJVar1 = sp + -1;
  piVar2 = (int *)(pJVar1->u).ptr;
  iVar3 = sp[-1].tag;
  JVar5 = *pJVar1;
  obj = JS_GetIterator(ctx,*pJVar1,is_async);
  iVar4 = -1;
  if ((int)obj.tag != 6) {
    if ((0xfffffff4 < (uint)iVar3) && (iVar4 = *piVar2, *piVar2 = iVar4 + -1, iVar4 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar5);
    }
    sp[-1] = obj;
    JVar5 = JS_GetPropertyInternal(ctx,obj,0x6a,obj,0);
    iVar4 = -1;
    if ((int)JVar5.tag != 6) {
      *sp = JVar5;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static __exception int js_for_of_start(JSContext *ctx, JSValue *sp,
                                       BOOL is_async)
{
    JSValue op1, obj, method;
    op1 = sp[-1];
    obj = JS_GetIterator(ctx, op1, is_async);
    if (JS_IsException(obj))
        return -1;
    JS_FreeValue(ctx, op1);
    sp[-1] = obj;
    method = JS_GetProperty(ctx, obj, JS_ATOM_next);
    if (JS_IsException(method))
        return -1;
    sp[0] = method;
    return 0;
}